

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

const_reference __thiscall
immutable::transient_vector<int,_false,_6>::back(transient_vector<int,_false,_6> *this)

{
  uint32_t uVar1;
  leaf_node<int,_false> *plVar2;
  int *piVar3;
  char *__function;
  ref<immutable::transient_rrb<int,_false,_6>_> local_10;
  
  rrb_details::check_transience<int,false,6>(&this->_impl);
  local_10.ptr = (this->_impl).ptr;
  if (local_10.ptr == (transient_rrb<int,_false,_6> *)0x0) {
    __function = 
    "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
    ;
  }
  else {
    (local_10.ptr)->_ref_count = (local_10.ptr)->_ref_count + 1;
    plVar2 = ((local_10.ptr)->tail).ptr;
    if (plVar2 != (leaf_node<int,_false> *)0x0) {
      uVar1 = (local_10.ptr)->tail_len;
      piVar3 = plVar2->child;
      ref<immutable::rrb<int,_false,_6>_>::~ref((ref<immutable::rrb<int,_false,_6>_> *)&local_10);
      return piVar3 + (uVar1 - 1);
    }
    __function = 
    "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
    ;
  }
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

const_reference back() const
        {
        return transient_rrb_peek(_impl);
        }